

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::delete_root(Patch *this)

{
  Node *root;
  Node *pNVar1;
  uint32_t uVar2;
  Node *root_parent;
  Patch *node_to_delete;
  Node *left;
  
  root = this->root;
  root_parent = (Node *)0x0;
  do {
    pNVar1 = root->left;
    if (pNVar1 == (Node *)0x0) {
      pNVar1 = root->right;
      if (pNVar1 == (Node *)0x0) {
        node_to_delete = this;
        if (root_parent != (Node *)0x0) {
          node_to_delete = (Patch *)(&root_parent->left + (root_parent->left != root));
        }
        delete_node(this,&node_to_delete->root);
        return;
      }
      rotate_node_left(this,pNVar1,root,root_parent);
      root_parent = pNVar1;
    }
    else {
      rotate_node_right(this,pNVar1,root,root_parent);
      root_parent = pNVar1;
    }
    uVar2 = Node::old_text_size(root);
    root_parent->old_subtree_text_size = root_parent->old_subtree_text_size - uVar2;
    uVar2 = Node::new_text_size(root);
    root_parent->new_subtree_text_size = root_parent->new_subtree_text_size - uVar2;
  } while( true );
}

Assistant:

void Patch::delete_root() {
  Node *node = root, *parent = nullptr;
  while (true) {
    if (node->left) {
      Node *left = node->left;
      rotate_node_right(node->left, node, parent);
      parent = left;
    } else if (node->right) {
      Node *right = node->right;
      rotate_node_left(node->right, node, parent);
      parent = right;
    } else if (parent) {
      if (parent->left == node) {
        delete_node(&parent->left);
        break;
      } else {
        delete_node(&parent->right);
        break;
      }
    } else {
      delete_node(&root);
      break;
    }

    parent->old_subtree_text_size -= node->old_text_size();
    parent->new_subtree_text_size -= node->new_text_size();
  }
}